

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  int *__s;
  int *__s_00;
  unsigned_short *puVar14;
  unsigned_short *puVar15;
  int *__s_01;
  unsigned_short *puVar16;
  uchar *puVar17;
  uint *puVar18;
  undefined1 (*frequencies) [16];
  undefined1 (*frequencies_00) [16];
  void *__dest;
  void *__ptr;
  unsigned_short uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  size_t sVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  size_t sVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  size_t sVar38;
  uint *puVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar86;
  int iVar87;
  undefined1 auVar85 [16];
  int iVar88;
  LodePNGBitWriter local_168;
  uivector lz77_encoded;
  ucvector v;
  HuffmanTree tree_ll;
  undefined1 local_c8 [48];
  HuffmanTree tree_d;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_168.data = &v;
  local_168.bp = '\0';
  uVar36 = settings->btype;
  uVar13 = 0x3d;
  if (uVar36 < 3) {
    sVar32 = insize;
    v.allocsize = v.size;
    if (uVar36 != 1) {
      if (uVar36 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar13 = 0;
        }
        else {
          uVar37 = (insize + 0xfffe) / 0xffff;
          lVar34 = 0;
          do {
            sVar32 = v.size;
            uVar36 = (int)insize - (int)lVar34;
            if (0xfffe < insize - lVar34) {
              uVar36 = 0xffff;
            }
            uVar26 = (ulong)uVar36;
            v.size = uVar26 + v.size + 5;
            puVar17 = v.data;
            sVar38 = v.allocsize;
            if (v.allocsize < v.size) {
              sVar38 = v.size + (v.allocsize >> 1);
              puVar17 = (uchar *)realloc(v.data,sVar38);
              if (puVar17 != (uchar *)0x0) goto LAB_001dfefb;
              bVar8 = true;
            }
            else {
LAB_001dfefb:
              v.allocsize = sVar38;
              v.data = puVar17;
              bVar8 = false;
            }
            if (!bVar8) {
              v.data[sVar32] = uVar37 == 1;
              v.data[sVar32 + 1] = (uchar)uVar36;
              v.data[sVar32 + 2] = (uchar)(uVar36 >> 8);
              v.data[sVar32 + 3] = (uchar)(0xffff - uVar36);
              v.data[sVar32 + 4] = (uchar)(0xffff - uVar36 >> 8);
              if (uVar26 != 0) {
                memcpy(v.data + sVar32 + 5,in + lVar34,uVar26);
              }
              lVar34 = lVar34 + uVar26;
            }
            if (bVar8) {
              uVar13 = 0x53;
              goto LAB_001e0b51;
            }
            uVar37 = uVar37 - 1;
          } while (uVar37 != 0);
          uVar13 = 0;
        }
        goto LAB_001e0b51;
      }
      uVar37 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar37 = insize >> 3;
      }
      if (0x3fff7 < uVar37) {
        uVar37 = 0x3fff8;
      }
      sVar32 = uVar37 + 8;
    }
    uVar37 = 1;
    if (!CARRY8(insize - 1,sVar32)) {
      uVar37 = ((insize - 1) + sVar32) / sVar32;
    }
    uVar26 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    __s_00 = (int *)malloc(uVar26 * 4);
    sVar28 = uVar26 * 2;
    hash.val = __s_00;
    puVar14 = (unsigned_short *)malloc(sVar28);
    hash.chain = puVar14;
    puVar15 = (unsigned_short *)malloc(sVar28);
    hash.zeros = puVar15;
    __s_01 = (int *)malloc(0x40c);
    hash.headz = __s_01;
    puVar16 = (unsigned_short *)malloc(sVar28);
    uVar13 = 0x53;
    hash.chainz = puVar16;
    if (__s_00 == (int *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = false;
      if ((((__s != (int *)0x0) && (puVar14 != (unsigned_short *)0x0)) &&
          (bVar8 = false, puVar15 != (unsigned_short *)0x0)) &&
         ((__s_01 != (int *)0x0 && (puVar16 != (unsigned_short *)0x0)))) {
        memset(__s,0xff,0x40000);
        if (uVar26 == 0) {
          memset(__s_01,0xff,0x40c);
        }
        else {
          memset(__s_00,0xff,uVar26 * 4);
          auVar9 = _DAT_001fd370;
          lVar34 = uVar26 - 1;
          auVar85._8_4_ = (int)lVar34;
          auVar85._0_8_ = lVar34;
          auVar85._12_4_ = (int)((ulong)lVar34 >> 0x20);
          uVar20 = 0;
          auVar85 = auVar85 ^ _DAT_001fd370;
          auVar53 = _DAT_001fd5c0;
          auVar79 = _DAT_001fd5d0;
          auVar83 = _DAT_001fd5e0;
          auVar57 = _DAT_001fd5f0;
          do {
            auVar44 = auVar57 ^ auVar9;
            iVar84 = auVar85._0_4_;
            iVar71 = -(uint)(iVar84 < auVar44._0_4_);
            iVar86 = auVar85._4_4_;
            auVar45._4_4_ = -(uint)(iVar86 < auVar44._4_4_);
            iVar87 = auVar85._8_4_;
            iVar76 = -(uint)(iVar87 < auVar44._8_4_);
            iVar88 = auVar85._12_4_;
            auVar45._12_4_ = -(uint)(iVar88 < auVar44._12_4_);
            auVar64._4_4_ = iVar71;
            auVar64._0_4_ = iVar71;
            auVar64._8_4_ = iVar76;
            auVar64._12_4_ = iVar76;
            auVar77 = pshuflw(in_XMM8,auVar64,0xe8);
            auVar47._4_4_ = -(uint)(auVar44._4_4_ == iVar86);
            auVar47._12_4_ = -(uint)(auVar44._12_4_ == iVar88);
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar82 = pshuflw(in_XMM9,auVar47,0xe8);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar78 = pshuflw(auVar77,auVar45,0xe8);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar44 = (auVar78 | auVar82 & auVar77) ^ auVar44;
            auVar44 = packssdw(auVar44,auVar44);
            uVar19 = (unsigned_short)uVar20;
            if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar14[uVar20] = uVar19;
            }
            auVar45 = auVar47 & auVar64 | auVar45;
            auVar44 = packssdw(auVar45,auVar45);
            auVar78._8_4_ = 0xffffffff;
            auVar78._0_8_ = 0xffffffffffffffff;
            auVar78._12_4_ = 0xffffffff;
            auVar44 = packssdw(auVar44 ^ auVar78,auVar44 ^ auVar78);
            if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
              puVar14[uVar20 + 1] = uVar19 + 1;
            }
            auVar44 = auVar83 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar44._0_4_);
            auVar72._4_4_ = -(uint)(iVar86 < auVar44._4_4_);
            iVar76 = -(uint)(iVar87 < auVar44._8_4_);
            auVar72._12_4_ = -(uint)(iVar88 < auVar44._12_4_);
            auVar46._4_4_ = iVar71;
            auVar46._0_4_ = iVar71;
            auVar46._8_4_ = iVar76;
            auVar46._12_4_ = iVar76;
            auVar63._4_4_ = -(uint)(auVar44._4_4_ == iVar86);
            auVar63._12_4_ = -(uint)(auVar44._12_4_ == iVar88);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar44 = auVar63 & auVar46 | auVar72;
            auVar44 = packssdw(auVar44,auVar44);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            auVar44 = packssdw(auVar44 ^ auVar2,auVar44 ^ auVar2);
            if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar14[uVar20 + 2] = uVar19 + 2;
            }
            auVar47 = pshufhw(auVar46,auVar46,0x84);
            auVar64 = pshufhw(auVar63,auVar63,0x84);
            auVar45 = pshufhw(auVar47,auVar72,0x84);
            auVar48._8_4_ = 0xffffffff;
            auVar48._0_8_ = 0xffffffffffffffff;
            auVar48._12_4_ = 0xffffffff;
            auVar48 = (auVar45 | auVar64 & auVar47) ^ auVar48;
            auVar47 = packssdw(auVar48,auVar48);
            if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar14[uVar20 + 3] = uVar19 + 3;
            }
            auVar47 = auVar79 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar47._0_4_);
            auVar50._4_4_ = -(uint)(iVar86 < auVar47._4_4_);
            iVar76 = -(uint)(iVar87 < auVar47._8_4_);
            auVar50._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
            auVar65._4_4_ = iVar71;
            auVar65._0_4_ = iVar71;
            auVar65._8_4_ = iVar76;
            auVar65._12_4_ = iVar76;
            auVar44 = pshuflw(auVar44,auVar65,0xe8);
            auVar49._4_4_ = -(uint)(auVar47._4_4_ == iVar86);
            auVar49._12_4_ = -(uint)(auVar47._12_4_ == iVar88);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            in_XMM9 = pshuflw(auVar82 & auVar77,auVar49,0xe8);
            in_XMM9 = in_XMM9 & auVar44;
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar44 = pshuflw(auVar44,auVar50,0xe8);
            auVar77._8_4_ = 0xffffffff;
            auVar77._0_8_ = 0xffffffffffffffff;
            auVar77._12_4_ = 0xffffffff;
            auVar77 = (auVar44 | in_XMM9) ^ auVar77;
            auVar44 = packssdw(auVar77,auVar77);
            if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar14[uVar20 + 4] = uVar19 + 4;
            }
            auVar50 = auVar49 & auVar65 | auVar50;
            auVar44 = packssdw(auVar50,auVar50);
            auVar82._8_4_ = 0xffffffff;
            auVar82._0_8_ = 0xffffffffffffffff;
            auVar82._12_4_ = 0xffffffff;
            auVar44 = packssdw(auVar44 ^ auVar82,auVar44 ^ auVar82);
            if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar14[uVar20 + 5] = uVar19 + 5;
            }
            auVar44 = auVar53 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar44._0_4_);
            auVar73._4_4_ = -(uint)(iVar86 < auVar44._4_4_);
            iVar76 = -(uint)(iVar87 < auVar44._8_4_);
            auVar73._12_4_ = -(uint)(iVar88 < auVar44._12_4_);
            auVar51._4_4_ = iVar71;
            auVar51._0_4_ = iVar71;
            auVar51._8_4_ = iVar76;
            auVar51._12_4_ = iVar76;
            auVar66._4_4_ = -(uint)(auVar44._4_4_ == iVar86);
            auVar66._12_4_ = -(uint)(auVar44._12_4_ == iVar88);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar44 = auVar66 & auVar51 | auVar73;
            auVar44 = packssdw(auVar44,auVar44);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar44 ^ auVar3,auVar44 ^ auVar3);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar14[uVar20 + 6] = uVar19 + 6;
            }
            auVar44 = pshufhw(auVar51,auVar51,0x84);
            auVar45 = pshufhw(auVar66,auVar66,0x84);
            auVar47 = pshufhw(auVar44,auVar73,0x84);
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            auVar52 = (auVar47 | auVar45 & auVar44) ^ auVar52;
            auVar44 = packssdw(auVar52,auVar52);
            if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar14[uVar20 + 7] = uVar19 + 7;
            }
            uVar20 = uVar20 + 8;
            lVar34 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + 8;
            auVar57._8_8_ = lVar34 + 8;
            lVar34 = auVar83._8_8_;
            auVar83._0_8_ = auVar83._0_8_ + 8;
            auVar83._8_8_ = lVar34 + 8;
            lVar34 = auVar79._8_8_;
            auVar79._0_8_ = auVar79._0_8_ + 8;
            auVar79._8_8_ = lVar34 + 8;
            lVar34 = auVar53._8_8_;
            auVar53._0_8_ = auVar53._0_8_ + 8;
            auVar53._8_8_ = lVar34 + 8;
          } while ((uVar26 + 7 & 0xfffffffffffffff8) != uVar20);
          memset(__s_01,0xff,0x40c);
          auVar9 = _DAT_001fd370;
          uVar20 = 0;
          auVar40 = _DAT_001fd5c0;
          auVar41 = _DAT_001fd5d0;
          auVar42 = _DAT_001fd5e0;
          auVar43 = _DAT_001fd5f0;
          do {
            auVar53 = auVar43 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar53._0_4_);
            auVar55._4_4_ = -(uint)(iVar86 < auVar53._4_4_);
            iVar76 = -(uint)(iVar87 < auVar53._8_4_);
            auVar55._12_4_ = -(uint)(iVar88 < auVar53._12_4_);
            auVar67._4_4_ = iVar71;
            auVar67._0_4_ = iVar71;
            auVar67._8_4_ = iVar76;
            auVar67._12_4_ = iVar76;
            auVar79 = pshuflw(in_XMM8,auVar67,0xe8);
            auVar54._4_4_ = -(uint)(auVar53._4_4_ == iVar86);
            auVar54._12_4_ = -(uint)(auVar53._12_4_ == iVar88);
            auVar54._0_4_ = auVar54._4_4_;
            auVar54._8_4_ = auVar54._12_4_;
            auVar83 = pshuflw(in_XMM9,auVar54,0xe8);
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar53 = pshuflw(auVar79,auVar55,0xe8);
            auVar80._8_4_ = 0xffffffff;
            auVar80._0_8_ = 0xffffffffffffffff;
            auVar80._12_4_ = 0xffffffff;
            auVar80 = (auVar53 | auVar83 & auVar79) ^ auVar80;
            auVar53 = packssdw(auVar80,auVar80);
            uVar19 = (unsigned_short)uVar20;
            if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar16[uVar20] = uVar19;
            }
            auVar55 = auVar54 & auVar67 | auVar55;
            auVar53 = packssdw(auVar55,auVar55);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar53 = packssdw(auVar53 ^ auVar4,auVar53 ^ auVar4);
            if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
              puVar16[uVar20 + 1] = uVar19 + 1;
            }
            auVar53 = auVar42 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar53._0_4_);
            auVar74._4_4_ = -(uint)(iVar86 < auVar53._4_4_);
            iVar76 = -(uint)(iVar87 < auVar53._8_4_);
            auVar74._12_4_ = -(uint)(iVar88 < auVar53._12_4_);
            auVar56._4_4_ = iVar71;
            auVar56._0_4_ = iVar71;
            auVar56._8_4_ = iVar76;
            auVar56._12_4_ = iVar76;
            auVar68._4_4_ = -(uint)(auVar53._4_4_ == iVar86);
            auVar68._12_4_ = -(uint)(auVar53._12_4_ == iVar88);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar53 = auVar68 & auVar56 | auVar74;
            auVar53 = packssdw(auVar53,auVar53);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar53 = packssdw(auVar53 ^ auVar5,auVar53 ^ auVar5);
            if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar16[uVar20 + 2] = uVar19 + 2;
            }
            auVar57 = pshufhw(auVar56,auVar56,0x84);
            auVar44 = pshufhw(auVar68,auVar68,0x84);
            auVar85 = pshufhw(auVar57,auVar74,0x84);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar58 = (auVar85 | auVar44 & auVar57) ^ auVar58;
            auVar57 = packssdw(auVar58,auVar58);
            if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar16[uVar20 + 3] = uVar19 + 3;
            }
            auVar57 = auVar41 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar57._0_4_);
            auVar60._4_4_ = -(uint)(iVar86 < auVar57._4_4_);
            iVar76 = -(uint)(iVar87 < auVar57._8_4_);
            auVar60._12_4_ = -(uint)(iVar88 < auVar57._12_4_);
            auVar69._4_4_ = iVar71;
            auVar69._0_4_ = iVar71;
            auVar69._8_4_ = iVar76;
            auVar69._12_4_ = iVar76;
            auVar53 = pshuflw(auVar53,auVar69,0xe8);
            auVar59._4_4_ = -(uint)(auVar57._4_4_ == iVar86);
            auVar59._12_4_ = -(uint)(auVar57._12_4_ == iVar88);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            in_XMM9 = pshuflw(auVar83 & auVar79,auVar59,0xe8);
            in_XMM9 = in_XMM9 & auVar53;
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar53 = pshuflw(auVar53,auVar60,0xe8);
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            auVar81 = (auVar53 | in_XMM9) ^ auVar81;
            auVar53 = packssdw(auVar81,auVar81);
            if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar16[uVar20 + 4] = uVar19 + 4;
            }
            auVar60 = auVar59 & auVar69 | auVar60;
            auVar53 = packssdw(auVar60,auVar60);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar53 = packssdw(auVar53 ^ auVar6,auVar53 ^ auVar6);
            if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar16[uVar20 + 5] = uVar19 + 5;
            }
            auVar53 = auVar40 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar53._0_4_);
            auVar75._4_4_ = -(uint)(iVar86 < auVar53._4_4_);
            iVar76 = -(uint)(iVar87 < auVar53._8_4_);
            auVar75._12_4_ = -(uint)(iVar88 < auVar53._12_4_);
            auVar61._4_4_ = iVar71;
            auVar61._0_4_ = iVar71;
            auVar61._8_4_ = iVar76;
            auVar61._12_4_ = iVar76;
            auVar70._4_4_ = -(uint)(auVar53._4_4_ == iVar86);
            auVar70._12_4_ = -(uint)(auVar53._12_4_ == iVar88);
            auVar70._0_4_ = auVar70._4_4_;
            auVar70._8_4_ = auVar70._12_4_;
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar53 = auVar70 & auVar61 | auVar75;
            auVar53 = packssdw(auVar53,auVar53);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar53 ^ auVar7,auVar53 ^ auVar7);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar16[uVar20 + 6] = uVar19 + 6;
            }
            auVar53 = pshufhw(auVar61,auVar61,0x84);
            auVar83 = pshufhw(auVar70,auVar70,0x84);
            auVar79 = pshufhw(auVar53,auVar75,0x84);
            auVar62._8_4_ = 0xffffffff;
            auVar62._0_8_ = 0xffffffffffffffff;
            auVar62._12_4_ = 0xffffffff;
            auVar62 = (auVar79 | auVar83 & auVar53) ^ auVar62;
            auVar53 = packssdw(auVar62,auVar62);
            if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar16[uVar20 + 7] = uVar19 + 7;
            }
            uVar20 = uVar20 + 8;
            lVar34 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + 8;
            auVar43._8_8_ = lVar34 + 8;
            lVar34 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 8;
            auVar42._8_8_ = lVar34 + 8;
            lVar34 = auVar41._8_8_;
            auVar41._0_8_ = auVar41._0_8_ + 8;
            auVar41._8_8_ = lVar34 + 8;
            lVar34 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + 8;
            auVar40._8_8_ = lVar34 + 8;
          } while ((uVar26 + 7 & 0x1fffffff8) != uVar20);
        }
        uVar13 = 0;
        bVar8 = true;
      }
    }
    if (bVar8) {
      if (uVar37 == 0) {
        uVar13 = 0;
      }
      else {
        lVar34 = 0;
        uVar13 = 0;
        uVar20 = 0;
        puVar17 = in;
        uVar26 = sVar32;
        do {
          uVar23 = uVar26;
          if (insize < uVar26) {
            uVar23 = insize;
          }
          uVar35 = uVar20 * sVar32;
          uVar21 = sVar32 + uVar35;
          if (insize <= sVar32 + uVar35) {
            uVar21 = insize;
          }
          uVar36 = (uint)(uVar20 == uVar37 - 1);
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            local_c8._0_8_ = (uint *)0x0;
            local_c8._8_8_ = (uint *)0x0;
            local_c8._24_16_ = (undefined1  [16])0x0;
            puVar18 = (uint *)malloc(0x478);
            frequencies = (undefined1 (*) [16])malloc(0x78);
            frequencies_00 = (undefined1 (*) [16])malloc(0x4c);
            if ((frequencies == (undefined1 (*) [16])0x0 || puVar18 == (uint *)0x0) ||
                frequencies_00 == (undefined1 (*) [16])0x0) {
LAB_001e036f:
              uVar13 = 0x53;
              __ptr = (void *)0x0;
              __dest = (void *)0x0;
            }
            else {
              memset(puVar18,0,0x478);
              *frequencies = (undefined1  [16])0x0;
              frequencies[1] = (undefined1  [16])0x0;
              frequencies[2] = (undefined1  [16])0x0;
              frequencies[3] = (undefined1  [16])0x0;
              frequencies[4] = (undefined1  [16])0x0;
              frequencies[5] = (undefined1  [16])0x0;
              frequencies[6] = (undefined1  [16])0x0;
              *(undefined8 *)frequencies[7] = 0;
              *(undefined1 (*) [16])(frequencies_00[3] + 0xc) = (undefined1  [16])0x0;
              frequencies_00[3] = (undefined1  [16])0x0;
              frequencies_00[2] = (undefined1  [16])0x0;
              frequencies_00[1] = (undefined1  [16])0x0;
              *frequencies_00 = (undefined1  [16])0x0;
              if (settings->use_lz77 == 0) {
                sVar38 = uVar21 - uVar35;
                uVar22 = sVar38 * 4;
                puVar39 = lz77_encoded.data;
                if (lz77_encoded.allocsize <= uVar22 && uVar22 - lz77_encoded.allocsize != 0) {
                  sVar28 = (lz77_encoded.allocsize >> 1) + uVar22;
                  puVar39 = (uint *)realloc(lz77_encoded.data,sVar28);
                  lz77_encoded.allocsize = sVar28;
                  if (puVar39 == (uint *)0x0) goto LAB_001e036f;
                }
                lz77_encoded.data = puVar39;
                lz77_encoded.size = sVar38;
                if (uVar35 < uVar21) {
                  lVar27 = 0;
                  do {
                    lz77_encoded.data[lVar27] = (uint)puVar17[lVar27];
                    lVar27 = lVar27 + 1;
                  } while (uVar23 + lVar34 != lVar27);
                }
              }
              else {
                uVar13 = encodeLZ77(&lz77_encoded,&hash,in,uVar35,uVar21,settings->windowsize,
                                    settings->minmatch,settings->nicematch,settings->lazymatching);
                if (uVar13 != 0) {
                  __ptr = (void *)0x0;
                  __dest = (void *)0x0;
                  goto LAB_001e04a0;
                }
              }
              if (lz77_encoded.size != 0) {
                sVar38 = 0;
                do {
                  uVar13 = lz77_encoded.data[sVar38];
                  puVar18[uVar13] = puVar18[uVar13] + 1;
                  if (0x100 < (ulong)uVar13) {
                    *(int *)(*frequencies + (ulong)lz77_encoded.data[sVar38 + 2] * 4) =
                         *(int *)(*frequencies + (ulong)lz77_encoded.data[sVar38 + 2] * 4) + 1;
                    sVar38 = sVar38 + 3;
                  }
                  sVar38 = sVar38 + 1;
                } while (sVar38 != lz77_encoded.size);
              }
              puVar18[0x100] = 1;
              uVar13 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar18,0x101,0x11e,0xf);
              if ((uVar13 == 0) &&
                 (uVar13 = HuffmanTree_makeFromFrequencies(&tree_d,(uint *)frequencies,2,0x1e,0xf),
                 uVar12 = tree_d.numcodes, uVar30 = tree_ll.numcodes, uVar13 == 0)) {
                uVar23 = 0x11e;
                if (tree_ll.numcodes < 0x11e) {
                  uVar23 = (ulong)tree_ll.numcodes;
                }
                uVar21 = 0x1e;
                if (tree_d.numcodes < 0x1e) {
                  uVar21 = (ulong)tree_d.numcodes;
                }
                uVar35 = uVar21 + uVar23;
                uVar22 = (ulong)(uint)((int)uVar35 * 4);
                __dest = malloc(uVar22);
                __ptr = malloc(uVar22);
                if (__ptr == (void *)0x0 || __dest == (void *)0x0) {
                  uVar13 = 0x53;
                }
                else {
                  if (uVar30 != 0) {
                    memcpy(__dest,tree_ll.lengths,uVar23 * 4);
                  }
                  if (uVar12 != 0) {
                    memcpy((void *)((long)__dest + uVar23 * 4),tree_d.lengths,uVar21 * 4);
                  }
                  if (uVar35 == 0) {
                    lVar27 = 0;
                  }
                  else {
                    uVar22 = 0;
                    lVar25 = 0;
                    do {
                      uVar1 = uVar22 + 1;
                      uVar24 = 0;
                      if (uVar1 < uVar35) {
                        uVar24 = 0;
                        uVar31 = uVar1;
                        do {
                          if (*(int *)((long)__dest + uVar31 * 4) !=
                              *(int *)((long)__dest + uVar22 * 4)) break;
                          uVar24 = (ulong)((int)uVar24 + 1);
                          uVar31 = uVar1 + uVar24;
                        } while (uVar31 < uVar35);
                      }
                      iVar71 = *(int *)((long)__dest + uVar22 * 4);
                      uVar13 = (uint)uVar24;
                      if ((uVar13 < 2) || (iVar71 != 0)) {
                        if (2 < uVar13) {
                          *(int *)((long)__ptr + lVar25 * 4) = iVar71;
                          lVar27 = lVar25 + 1;
                          if (5 < uVar13) {
                            lVar29 = (long)__ptr + lVar25 * 4 + 8;
                            lVar33 = 0;
                            do {
                              *(undefined8 *)(lVar29 + -4) = 0x300000010;
                              lVar29 = lVar29 + 8;
                              lVar33 = lVar33 + -2;
                            } while ((ulong)(uint)((int)(uVar24 / 6) * 2) + lVar33 != 0);
                            lVar27 = lVar27 - lVar33;
                            lVar25 = lVar25 - lVar33;
                          }
                          uVar30 = uVar13 + (int)(uVar24 / 6) * -6;
                          if (uVar30 < 3) {
                            uVar13 = uVar13 - uVar30;
                          }
                          else {
                            *(undefined4 *)((long)__ptr + lVar27 * 4) = 0x10;
                            *(uint *)((long)__ptr + lVar25 * 4 + 8) = uVar30 - 3;
                            lVar27 = lVar25 + 3;
                          }
                          goto LAB_001e084a;
                        }
                        *(int *)((long)__ptr + lVar25 * 4) = iVar71;
                        lVar27 = lVar25 + 1;
                      }
                      else {
                        uVar30 = uVar13 + 1;
                        if (uVar30 < 0xb) {
                          *(undefined4 *)((long)__ptr + lVar25 * 4) = 0x11;
                          *(uint *)((long)__ptr + lVar25 * 4 + 4) = uVar13 - 2;
                        }
                        else {
                          if (0x89 < uVar30) {
                            uVar30 = 0x8a;
                          }
                          *(undefined4 *)((long)__ptr + lVar25 * 4) = 0x12;
                          *(uint *)((long)__ptr + lVar25 * 4 + 4) = uVar30 - 0xb;
                          uVar13 = uVar30 - 1;
                        }
                        lVar27 = lVar25 + 2;
LAB_001e084a:
                        uVar22 = uVar22 + uVar13;
                      }
                      uVar22 = uVar22 + 1;
                      lVar25 = lVar27;
                    } while (uVar22 != uVar35);
                  }
                  if (lVar27 != 0) {
                    lVar25 = 0;
                    do {
                      uVar35 = (ulong)*(uint *)((long)__ptr + lVar25 * 4);
                      *(int *)(*frequencies_00 + uVar35 * 4) =
                           *(int *)(*frequencies_00 + uVar35 * 4) + 1;
                      lVar25 = (lVar25 - (ulong)(uVar35 < 0x10)) + 2;
                    } while (lVar25 != lVar27);
                  }
                  uVar13 = HuffmanTree_makeFromFrequencies
                                     ((HuffmanTree *)local_c8,(uint *)frequencies_00,0x13,0x13,7);
                  uVar11 = local_c8._8_8_;
                  if (uVar13 == 0) {
                    uVar35 = 0x14;
                    lVar25 = 0x13;
                    do {
                      lVar29 = lVar25;
                      uVar22 = uVar35 - 1;
                      if (uVar22 < 5) {
                        uVar22 = 4;
                        break;
                      }
                      lVar33 = uVar35 * 4;
                      uVar35 = uVar22;
                      lVar25 = lVar29 + -1;
                    } while (*(uint *)(local_c8._8_8_ + (ulong)*(uint *)(&UNK_0021f918 + lVar33) * 4
                                      ) == 0);
                    writeBits(&local_168,uVar36,1);
                    writeBits(&local_168,0,1);
                    writeBits(&local_168,1,1);
                    writeBits(&local_168,(int)uVar23 - 0x101,5);
                    writeBits(&local_168,(int)uVar21 - 1,5);
                    writeBits(&local_168,(int)uVar22 - 4,4);
                    puVar39 = CLCL_ORDER;
                    do {
                      writeBits(&local_168,*(uint *)(uVar11 + (ulong)*puVar39 * 4),3);
                      uVar10 = local_c8._0_8_;
                      puVar39 = puVar39 + 1;
                      lVar29 = lVar29 + -1;
                    } while (lVar29 != 0);
                    if (lVar27 != 0) {
                      lVar25 = 0;
                      do {
                        uVar36 = *(uint *)((long)__ptr + lVar25 * 4);
                        writeBitsReversed(&local_168,*(uint *)(uVar10 + (ulong)uVar36 * 4),
                                          (ulong)*(uint *)(uVar11 + (ulong)uVar36 * 4));
                        if (uVar36 - 0x10 < 3) {
                          lVar29 = lVar25 * 4;
                          lVar25 = lVar25 + 1;
                          writeBits(&local_168,*(uint *)((long)__ptr + lVar29 + 4),
                                    *(size_t *)(&DAT_0021f9f0 + (ulong)(uVar36 - 0x10) * 8));
                        }
                        lVar25 = lVar25 + 1;
                      } while (lVar25 != lVar27);
                    }
                    writeLZ77data(&local_168,&lz77_encoded,&tree_ll,&tree_d);
                    if ((ulong)tree_ll.lengths[0x100] == 0) {
                      uVar13 = 0x40;
                    }
                    else {
                      writeBitsReversed(&local_168,tree_ll.codes[0x100],
                                        (ulong)tree_ll.lengths[0x100]);
                      uVar13 = 0;
                    }
                  }
                }
              }
              else {
                __ptr = (void *)0x0;
                __dest = (void *)0x0;
              }
            }
LAB_001e04a0:
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup((HuffmanTree *)local_c8);
            free(puVar18);
            free(frequencies);
            free(frequencies_00);
            free(__dest);
            free(__ptr);
          }
          else if (settings->btype == 1) {
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            uVar13 = generateFixedLitLenTree(&tree_ll);
            if (uVar13 == 0) {
              uVar13 = generateFixedDistanceTree(&tree_d);
            }
            if (uVar13 == 0) {
              writeBits(&local_168,uVar36,1);
              writeBits(&local_168,1,1);
              writeBits(&local_168,0,1);
              if (settings->use_lz77 == 0) {
                uVar13 = 0;
                if (uVar35 < uVar21) {
                  puVar18 = tree_ll.codes;
                  puVar39 = tree_ll.lengths;
                  lVar27 = 0;
                  do {
                    writeBitsReversed(&local_168,puVar18[puVar17[lVar27]],
                                      (ulong)puVar39[puVar17[lVar27]]);
                    lVar27 = lVar27 + 1;
                  } while (uVar23 + lVar34 != lVar27);
                  uVar13 = 0;
                }
              }
              else {
                local_c8._0_8_ = (uint *)0x0;
                local_c8._8_8_ = (uint *)0x0;
                local_c8._16_8_ = 0;
                uVar13 = encodeLZ77((uivector *)local_c8,&hash,in,uVar35,uVar21,settings->windowsize
                                    ,settings->minmatch,settings->nicematch,settings->lazymatching);
                if (uVar13 == 0) {
                  writeLZ77data(&local_168,(uivector *)local_c8,&tree_ll,&tree_d);
                }
                local_c8._8_8_ = (uint *)0x0;
                local_c8._16_8_ = 0;
                free((void *)local_c8._0_8_);
              }
              if (uVar13 == 0) {
                writeBitsReversed(&local_168,tree_ll.codes[0x100],(ulong)tree_ll.lengths[0x100]);
                uVar13 = 0;
              }
            }
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
          }
          uVar20 = uVar20 + 1;
          if (uVar20 == uVar37) break;
          uVar26 = uVar26 + sVar32;
          lVar34 = lVar34 - sVar32;
          puVar17 = puVar17 + sVar32;
        } while (uVar13 == 0);
      }
    }
    free(hash.head);
    free(hash.val);
    free(hash.chain);
    free(hash.zeros);
    free(hash.headz);
    free(hash.chainz);
  }
LAB_001e0b51:
  *out = v.data;
  *outsize = v.size;
  return uVar13;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}